

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3CodeRowTriggerDirect
               (Parse *pParse,Trigger *p,Table *pTab,int reg,int orconf,int ignoreJump)

{
  Vdbe *p_00;
  TriggerPrg *pTVar1;
  int p3;
  bool bVar2;
  
  p_00 = sqlite3GetVdbe(pParse);
  pTVar1 = getRowTrigger(pParse,p,pTab,orconf);
  if (pTVar1 != (TriggerPrg *)0x0) {
    if (p->zName == (char *)0x0) {
      bVar2 = false;
    }
    else {
      bVar2 = (pParse->db->flags & 0x20000) == 0;
    }
    p3 = pParse->nMem + 1;
    pParse->nMem = p3;
    sqlite3VdbeAddOp3(p_00,0x73,reg,ignoreJump,p3);
    sqlite3VdbeChangeP4(p_00,-1,(char *)pTVar1->pProgram,-0x12);
    if (p_00->aOp != (Op *)0x0) {
      p_00->aOp[(long)p_00->nOp + -1].p5 = bVar2;
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3CodeRowTriggerDirect(
  Parse *pParse,       /* Parse context */
  Trigger *p,          /* Trigger to code */
  Table *pTab,         /* The table to code triggers from */
  int reg,             /* Reg array containing OLD.* and NEW.* values */
  int orconf,          /* ON CONFLICT policy */
  int ignoreJump       /* Instruction to jump to for RAISE(IGNORE) */
){
  Vdbe *v = sqlite3GetVdbe(pParse); /* Main VM */
  TriggerPrg *pPrg;
  pPrg = getRowTrigger(pParse, p, pTab, orconf);
  assert( pPrg || pParse->nErr || pParse->db->mallocFailed );

  /* Code the OP_Program opcode in the parent VDBE. P4 of the OP_Program 
  ** is a pointer to the sub-vdbe containing the trigger program.  */
  if( pPrg ){
    int bRecursive = (p->zName && 0==(pParse->db->flags&SQLITE_RecTriggers));

    sqlite3VdbeAddOp3(v, OP_Program, reg, ignoreJump, ++pParse->nMem);
    sqlite3VdbeChangeP4(v, -1, (const char *)pPrg->pProgram, P4_SUBPROGRAM);
    VdbeComment(
        (v, "Call: %s.%s", (p->zName?p->zName:"fkey"), onErrorText(orconf)));

    /* Set the P5 operand of the OP_Program instruction to non-zero if
    ** recursive invocation of this trigger program is disallowed. Recursive
    ** invocation is disallowed if (a) the sub-program is really a trigger,
    ** not a foreign key action, and (b) the flag to enable recursive triggers
    ** is clear.  */
    sqlite3VdbeChangeP5(v, (u8)bRecursive);
  }
}